

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O2

void __thiscall
priority_queue_t<std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
::safe_pop(priority_queue_t<std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
           *this)

{
  undefined8 in_RAX;
  iterator __it;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  if (this->use_dense_version == true) {
    uStack_18 = CONCAT44((((this->
                           super_priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
                           ).c.
                           super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                         super_pair<float,_entry_t>).second.index,(int)in_RAX);
    __it = std::
           _Hashtable<int,_std::pair<const_int,_short>,_std::allocator<std::pair<const_int,_short>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::find(&(this->coefficients)._M_h,(key_type *)((long)&uStack_18 + 4));
    if (__it.super__Node_iterator_base<std::pair<const_int,_short>,_false>._M_cur !=
        (__node_type *)0x0) {
      std::
      _Hashtable<int,_std::pair<const_int,_short>,_std::allocator<std::pair<const_int,_short>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::erase(&(this->coefficients)._M_h,
              (const_iterator)
              __it.super__Node_iterator_base<std::pair<const_int,_short>,_false>._M_cur);
    }
  }
  std::
  priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
  ::pop(&this->
         super_priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
       );
  return;
}

Assistant:

inline void safe_pop() {
		if (use_dense_version) {
			auto e =
			    coefficients.find(get_index(std::priority_queue<filtration_entry_t, Container, Comparator>::top()));
			if (e != coefficients.end()) coefficients.erase(e);
		}
		std::priority_queue<filtration_entry_t, Container, Comparator>::pop();
	}